

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O0

void __thiscall hrvo::Simulator::~Simulator(Simulator *this)

{
  void *pvVar1;
  Agent *pAVar2;
  bool bVar3;
  reference ppAVar4;
  iterator this_00;
  reference ppGVar5;
  undefined8 *in_RDI;
  iterator iter_1;
  iterator iter;
  vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *in_stack_ffffffffffffff48;
  __normal_iterator<hrvo::Agent_**,_std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>_>
  *in_stack_ffffffffffffff50;
  Agent *in_stack_ffffffffffffff60;
  __normal_iterator<hrvo::Goal_**,_std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>_>
  local_30;
  Agent **local_28;
  __normal_iterator<hrvo::Agent_**,_std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>_>
  local_20 [4];
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    Agent::~Agent(in_stack_ffffffffffffff60);
    operator_delete(pvVar1);
  }
  *in_RDI = 0;
  pvVar1 = (void *)in_RDI[1];
  if (pvVar1 != (void *)0x0) {
    KdTree::~KdTree((KdTree *)in_stack_ffffffffffffff60);
    operator_delete(pvVar1);
  }
  in_RDI[1] = 0;
  local_20[0]._M_current =
       (Agent **)
       std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::begin(in_stack_ffffffffffffff48);
  while( true ) {
    local_28 = (Agent **)
               std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::end
                         (in_stack_ffffffffffffff48);
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<hrvo::Agent_**,_std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar3) break;
    ppAVar4 = __gnu_cxx::
              __normal_iterator<hrvo::Agent_**,_std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>_>
              ::operator*(local_20);
    pAVar2 = *ppAVar4;
    if (pAVar2 != (Agent *)0x0) {
      Agent::~Agent(in_stack_ffffffffffffff60);
      operator_delete(pAVar2);
    }
    ppAVar4 = __gnu_cxx::
              __normal_iterator<hrvo::Agent_**,_std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>_>
              ::operator*(local_20);
    *ppAVar4 = (Agent *)0x0;
    __gnu_cxx::
    __normal_iterator<hrvo::Agent_**,_std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>_>::
    operator++(local_20);
  }
  local_30._M_current =
       (Goal **)std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>::begin
                          ((vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_> *)
                           in_stack_ffffffffffffff48);
  while( true ) {
    this_00 = std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>::end
                        ((vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_> *)
                         in_stack_ffffffffffffff48);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<hrvo::Goal_**,_std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<hrvo::Goal_**,_std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar3) break;
    ppGVar5 = __gnu_cxx::
              __normal_iterator<hrvo::Goal_**,_std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>_>
              ::operator*(&local_30);
    if (*ppGVar5 != (Goal *)0x0) {
      operator_delete(*ppGVar5);
    }
    in_stack_ffffffffffffff50 =
         (__normal_iterator<hrvo::Agent_**,_std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>_>
          *)__gnu_cxx::
            __normal_iterator<hrvo::Goal_**,_std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>_>
            ::operator*(&local_30);
    in_stack_ffffffffffffff50->_M_current = (Agent **)0x0;
    __gnu_cxx::
    __normal_iterator<hrvo::Goal_**,_std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>_>::
    operator++(&local_30);
  }
  std::vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>::~vector
            ((vector<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_> *)this_00._M_current);
  std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::~vector
            ((vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_> *)this_00._M_current);
  return;
}

Assistant:

Simulator::~Simulator() {
  delete defaults_;
  defaults_ = NULL;

  delete kdTree_;
  kdTree_ = NULL;

  for (std::vector<Agent *>::iterator iter = agents_.begin();
       iter != agents_.end(); ++iter) {
    delete *iter;
    *iter = NULL;
  }

  for (std::vector<Goal *>::iterator iter = goals_.begin();
       iter != goals_.end(); ++iter) {
    delete *iter;
    *iter = NULL;
  }
}